

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_encoder.c
# Opt level: O0

void copy_and_encode(lzma_coder_conflict4 *coder,uint8_t *in,uint8_t *out,size_t size)

{
  uint8_t uVar1;
  uint8_t uVar2;
  byte bVar3;
  size_t sVar4;
  uint8_t tmp;
  size_t distance;
  size_t i;
  size_t size_local;
  uint8_t *out_local;
  uint8_t *in_local;
  lzma_coder_conflict4 *coder_local;
  
  sVar4 = coder->distance;
  for (distance = 0; distance < size; distance = distance + 1) {
    uVar1 = coder->history[sVar4 + coder->pos & 0xff];
    uVar2 = in[distance];
    bVar3 = coder->pos;
    coder->pos = bVar3 - 1;
    coder->history[(int)(uint)bVar3] = uVar2;
    out[distance] = in[distance] - uVar1;
  }
  return;
}

Assistant:

static void
copy_and_encode(lzma_coder *coder,
		const uint8_t *LZMA_RESTRICT in, uint8_t *LZMA_RESTRICT out, size_t size)
{
	size_t i;
	const size_t distance = coder->distance;

	for (i = 0; i < size; ++i) {
		const uint8_t tmp = coder->history[
				(distance + coder->pos) & 0xFF];
		coder->history[coder->pos-- & 0xFF] = in[i];
		out[i] = in[i] - tmp;
	}
}